

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct32_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  __m256i alVar3;
  undefined1 auVar4 [32];
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  lVar11 = (long)bit * 0x100;
  iVar15 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x228);
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1a8);
  iVar9 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1e8);
  iVar13 = -iVar15;
  iVar10 = -iVar8;
  iVar6 = -iVar9;
  iVar12 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x168);
  iVar7 = -iVar12;
  iVar14 = 1 << ((char)bit - 1U & 0x1f);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 600);
  auVar44._4_4_ = uVar1;
  auVar44._0_4_ = uVar1;
  auVar44._8_4_ = uVar1;
  auVar44._12_4_ = uVar1;
  auVar44._16_4_ = uVar1;
  auVar44._20_4_ = uVar1;
  auVar44._24_4_ = uVar1;
  auVar44._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1d8);
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  auVar49._16_4_ = uVar1;
  auVar49._20_4_ = uVar1;
  auVar49._24_4_ = uVar1;
  auVar49._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x218);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  auVar52._16_4_ = uVar1;
  auVar52._20_4_ = uVar1;
  auVar52._24_4_ = uVar1;
  auVar52._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x198);
  auVar59._4_4_ = uVar1;
  auVar59._0_4_ = uVar1;
  auVar59._8_4_ = uVar1;
  auVar59._12_4_ = uVar1;
  auVar59._16_4_ = uVar1;
  auVar59._20_4_ = uVar1;
  auVar59._24_4_ = uVar1;
  auVar59._28_4_ = uVar1;
  auVar57._4_4_ = iVar13;
  auVar57._0_4_ = iVar13;
  auVar57._8_4_ = iVar13;
  auVar57._12_4_ = iVar13;
  auVar57._16_4_ = iVar13;
  auVar57._20_4_ = iVar13;
  auVar57._24_4_ = iVar13;
  auVar57._28_4_ = iVar13;
  auVar29._4_4_ = iVar10;
  auVar29._0_4_ = iVar10;
  auVar29._8_4_ = iVar10;
  auVar29._12_4_ = iVar10;
  auVar29._16_4_ = iVar10;
  auVar29._20_4_ = iVar10;
  auVar29._24_4_ = iVar10;
  auVar29._28_4_ = iVar10;
  auVar35._4_4_ = iVar6;
  auVar35._0_4_ = iVar6;
  auVar35._8_4_ = iVar6;
  auVar35._12_4_ = iVar6;
  auVar35._16_4_ = iVar6;
  auVar35._20_4_ = iVar6;
  auVar35._24_4_ = iVar6;
  auVar35._28_4_ = iVar6;
  auVar40._4_4_ = iVar7;
  auVar40._0_4_ = iVar7;
  auVar40._8_4_ = iVar7;
  auVar40._12_4_ = iVar7;
  auVar40._16_4_ = iVar7;
  auVar40._20_4_ = iVar7;
  auVar40._24_4_ = iVar7;
  auVar40._28_4_ = iVar7;
  auVar43._4_4_ = iVar14;
  auVar43._0_4_ = iVar14;
  auVar43._8_4_ = iVar14;
  auVar43._12_4_ = iVar14;
  auVar43._16_4_ = iVar14;
  auVar43._20_4_ = iVar14;
  auVar43._24_4_ = iVar14;
  auVar43._28_4_ = iVar14;
  auVar4 = vpmulld_avx2((undefined1  [32])in[1],auVar44);
  auVar40 = vpmulld_avx2((undefined1  [32])in[0x1f],auVar40);
  auVar4 = vpaddd_avx2(auVar4,auVar43);
  auVar4 = vpaddd_avx2(auVar4,auVar40);
  auVar40 = vpmulld_avx2((undefined1  [32])in[0x11],auVar49);
  auVar35 = vpmulld_avx2((undefined1  [32])in[0xf],auVar35);
  auVar40 = vpaddd_avx2(auVar40,auVar43);
  auVar40 = vpaddd_avx2(auVar40,auVar35);
  auVar35 = vpmulld_avx2((undefined1  [32])in[9],auVar52);
  auVar29 = vpmulld_avx2((undefined1  [32])in[0x17],auVar29);
  auVar35 = vpaddd_avx2(auVar35,auVar43);
  auVar35 = vpaddd_avx2(auVar35,auVar29);
  auVar30 = vpmulld_avx2((undefined1  [32])in[7],auVar57);
  auVar29 = vpmulld_avx2((undefined1  [32])in[0x19],auVar59);
  auVar29 = vpaddd_avx2(auVar29,auVar43);
  auVar29 = vpaddd_avx2(auVar29,auVar30);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x188);
  iVar7 = -iVar6;
  auVar30._4_4_ = iVar7;
  auVar30._0_4_ = iVar7;
  auVar30._8_4_ = iVar7;
  auVar30._12_4_ = iVar7;
  auVar30._16_4_ = iVar7;
  auVar30._20_4_ = iVar7;
  auVar30._24_4_ = iVar7;
  auVar30._28_4_ = iVar7;
  auVar31 = vpmulld_avx2((undefined1  [32])in[0x1b],auVar30);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x238);
  auVar64._4_4_ = uVar1;
  auVar64._0_4_ = uVar1;
  auVar64._8_4_ = uVar1;
  auVar64._12_4_ = uVar1;
  auVar64._16_4_ = uVar1;
  auVar64._20_4_ = uVar1;
  auVar64._24_4_ = uVar1;
  auVar64._28_4_ = uVar1;
  auVar30 = vpmulld_avx2((undefined1  [32])in[5],auVar64);
  auVar30 = vpaddd_avx2(auVar30,auVar43);
  auVar30 = vpaddd_avx2(auVar30,auVar31);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x208);
  iVar10 = -iVar7;
  auVar31._4_4_ = iVar10;
  auVar31._0_4_ = iVar10;
  auVar31._8_4_ = iVar10;
  auVar31._12_4_ = iVar10;
  auVar31._16_4_ = iVar10;
  auVar31._20_4_ = iVar10;
  auVar31._24_4_ = iVar10;
  auVar31._28_4_ = iVar10;
  auVar57 = vpmulld_avx2((undefined1  [32])in[0xb],auVar31);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1b8);
  auVar50._4_4_ = uVar1;
  auVar50._0_4_ = uVar1;
  auVar50._8_4_ = uVar1;
  auVar50._12_4_ = uVar1;
  auVar50._16_4_ = uVar1;
  auVar50._20_4_ = uVar1;
  auVar50._24_4_ = uVar1;
  auVar50._28_4_ = uVar1;
  auVar31 = vpmulld_avx2((undefined1  [32])in[0x15],auVar50);
  auVar31 = vpaddd_avx2(auVar31,auVar43);
  auVar31 = vpaddd_avx2(auVar31,auVar57);
  iVar10 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1c8);
  iVar13 = -iVar10;
  auVar69._4_4_ = iVar13;
  auVar69._0_4_ = iVar13;
  auVar69._8_4_ = iVar13;
  auVar69._12_4_ = iVar13;
  auVar69._16_4_ = iVar13;
  auVar69._20_4_ = iVar13;
  auVar69._24_4_ = iVar13;
  auVar69._28_4_ = iVar13;
  auVar60 = vpmulld_avx2((undefined1  [32])in[0x13],auVar69);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1f8);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar41._16_4_ = uVar1;
  auVar41._20_4_ = uVar1;
  auVar41._24_4_ = uVar1;
  auVar41._28_4_ = uVar1;
  auVar57 = vpmulld_avx2((undefined1  [32])in[0xd],auVar41);
  auVar57 = vpaddd_avx2(auVar57,auVar43);
  auVar57 = vpaddd_avx2(auVar57,auVar60);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x248);
  iVar14 = -iVar13;
  auVar60._4_4_ = iVar14;
  auVar60._0_4_ = iVar14;
  auVar60._8_4_ = iVar14;
  auVar60._12_4_ = iVar14;
  auVar60._16_4_ = iVar14;
  auVar60._20_4_ = iVar14;
  auVar60._24_4_ = iVar14;
  auVar60._28_4_ = iVar14;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x178);
  auVar70._4_4_ = uVar1;
  auVar70._0_4_ = uVar1;
  auVar70._8_4_ = uVar1;
  auVar70._12_4_ = uVar1;
  auVar70._16_4_ = uVar1;
  auVar70._20_4_ = uVar1;
  auVar70._24_4_ = uVar1;
  auVar70._28_4_ = uVar1;
  auVar61 = vpmulld_avx2((undefined1  [32])in[3],auVar60);
  auVar60 = vpmulld_avx2((undefined1  [32])in[0x1d],auVar70);
  auVar60 = vpaddd_avx2(auVar60,auVar43);
  auVar60 = vpaddd_avx2(auVar60,auVar61);
  auVar61._4_4_ = iVar13;
  auVar61._0_4_ = iVar13;
  auVar61._8_4_ = iVar13;
  auVar61._12_4_ = iVar13;
  auVar61._16_4_ = iVar13;
  auVar61._20_4_ = iVar13;
  auVar61._24_4_ = iVar13;
  auVar61._28_4_ = iVar13;
  auVar61 = vpmulld_avx2((undefined1  [32])in[0x1d],auVar61);
  auVar17 = vpmulld_avx2((undefined1  [32])in[3],auVar70);
  auVar61 = vpaddd_avx2(auVar61,auVar43);
  auVar61 = vpaddd_avx2(auVar61,auVar17);
  auVar17._4_4_ = iVar10;
  auVar17._0_4_ = iVar10;
  auVar17._8_4_ = iVar10;
  auVar17._12_4_ = iVar10;
  auVar17._16_4_ = iVar10;
  auVar17._20_4_ = iVar10;
  auVar17._24_4_ = iVar10;
  auVar17._28_4_ = iVar10;
  auVar17 = vpmulld_avx2((undefined1  [32])in[0xd],auVar17);
  auVar18 = vpmulld_avx2((undefined1  [32])in[0x13],auVar41);
  auVar17 = vpaddd_avx2(auVar17,auVar43);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  auVar18._4_4_ = iVar7;
  auVar18._0_4_ = iVar7;
  auVar18._8_4_ = iVar7;
  auVar18._12_4_ = iVar7;
  auVar18._16_4_ = iVar7;
  auVar18._20_4_ = iVar7;
  auVar18._24_4_ = iVar7;
  auVar18._28_4_ = iVar7;
  auVar18 = vpmulld_avx2((undefined1  [32])in[0x15],auVar18);
  auVar19 = vpmulld_avx2((undefined1  [32])in[0xb],auVar50);
  auVar18 = vpaddd_avx2(auVar18,auVar43);
  auVar18 = vpaddd_avx2(auVar18,auVar19);
  auVar19._4_4_ = iVar6;
  auVar19._0_4_ = iVar6;
  auVar19._8_4_ = iVar6;
  auVar19._12_4_ = iVar6;
  auVar19._16_4_ = iVar6;
  auVar19._20_4_ = iVar6;
  auVar19._24_4_ = iVar6;
  auVar19._28_4_ = iVar6;
  auVar19 = vpmulld_avx2((undefined1  [32])in[5],auVar19);
  auVar20 = vpmulld_avx2((undefined1  [32])in[0x1b],auVar64);
  auVar19 = vpaddd_avx2(auVar19,auVar43);
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  auVar20._4_4_ = iVar15;
  auVar20._0_4_ = iVar15;
  auVar20._8_4_ = iVar15;
  auVar20._12_4_ = iVar15;
  auVar20._16_4_ = iVar15;
  auVar20._20_4_ = iVar15;
  auVar20._24_4_ = iVar15;
  auVar20._28_4_ = iVar15;
  auVar20 = vpmulld_avx2((undefined1  [32])in[0x19],auVar20);
  auVar21 = vpmulld_avx2(auVar59,(undefined1  [32])in[7]);
  auVar20 = vpaddd_avx2(auVar20,auVar43);
  auVar20 = vpaddd_avx2(auVar20,auVar21);
  auVar21._4_4_ = iVar8;
  auVar21._0_4_ = iVar8;
  auVar21._8_4_ = iVar8;
  auVar21._12_4_ = iVar8;
  auVar21._16_4_ = iVar8;
  auVar21._20_4_ = iVar8;
  auVar21._24_4_ = iVar8;
  auVar21._28_4_ = iVar8;
  auVar21 = vpmulld_avx2(auVar21,(undefined1  [32])in[9]);
  auVar22 = vpmulld_avx2((undefined1  [32])in[0x17],auVar52);
  auVar21 = vpaddd_avx2(auVar21,auVar43);
  auVar21 = vpaddd_avx2(auVar21,auVar22);
  auVar22._4_4_ = iVar9;
  auVar22._0_4_ = iVar9;
  auVar22._8_4_ = iVar9;
  auVar22._12_4_ = iVar9;
  auVar22._16_4_ = iVar9;
  auVar22._20_4_ = iVar9;
  auVar22._24_4_ = iVar9;
  auVar22._28_4_ = iVar9;
  auVar22 = vpmulld_avx2(auVar22,(undefined1  [32])in[0x11]);
  auVar23 = vpmulld_avx2((undefined1  [32])in[0xf],auVar49);
  auVar22 = vpaddd_avx2(auVar22,auVar43);
  auVar22 = vpaddd_avx2(auVar22,auVar23);
  auVar23._4_4_ = iVar12;
  auVar23._0_4_ = iVar12;
  auVar23._8_4_ = iVar12;
  auVar23._12_4_ = iVar12;
  auVar23._16_4_ = iVar12;
  auVar23._20_4_ = iVar12;
  auVar23._24_4_ = iVar12;
  auVar23._28_4_ = iVar12;
  auVar23 = vpmulld_avx2(auVar23,(undefined1  [32])in[1]);
  auVar36 = vpmulld_avx2((undefined1  [32])in[0x1f],auVar44);
  auVar23 = vpaddd_avx2(auVar23,auVar43);
  auVar23 = vpaddd_avx2(auVar23,auVar36);
  iVar15 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x170);
  iVar8 = -iVar15;
  auVar36._4_4_ = iVar8;
  auVar36._0_4_ = iVar8;
  auVar36._8_4_ = iVar8;
  auVar36._12_4_ = iVar8;
  auVar36._16_4_ = iVar8;
  auVar36._20_4_ = iVar8;
  auVar36._24_4_ = iVar8;
  auVar36._28_4_ = iVar8;
  auVar41 = vpmulld_avx2((undefined1  [32])in[0x1e],auVar36);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x250);
  auVar42._4_4_ = uVar1;
  auVar42._0_4_ = uVar1;
  auVar42._8_4_ = uVar1;
  auVar42._12_4_ = uVar1;
  auVar42._16_4_ = uVar1;
  auVar42._20_4_ = uVar1;
  auVar42._24_4_ = uVar1;
  auVar42._28_4_ = uVar1;
  auVar36 = vpmulld_avx2((undefined1  [32])in[2],auVar42);
  auVar36 = vpaddd_avx2(auVar36,auVar43);
  auVar36 = vpaddd_avx2(auVar36,auVar41);
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1f0);
  iVar9 = -iVar8;
  auVar45._4_4_ = iVar9;
  auVar45._0_4_ = iVar9;
  auVar45._8_4_ = iVar9;
  auVar45._12_4_ = iVar9;
  auVar45._16_4_ = iVar9;
  auVar45._20_4_ = iVar9;
  auVar45._24_4_ = iVar9;
  auVar45._28_4_ = iVar9;
  auVar44 = vpmulld_avx2((undefined1  [32])in[0xe],auVar45);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1d0);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  auVar46._16_4_ = uVar1;
  auVar46._20_4_ = uVar1;
  auVar46._24_4_ = uVar1;
  auVar46._28_4_ = uVar1;
  auVar41 = vpmulld_avx2((undefined1  [32])in[0x12],auVar46);
  auVar41 = vpaddd_avx2(auVar41,auVar43);
  auVar41 = vpaddd_avx2(auVar41,auVar44);
  iVar9 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1b0);
  iVar12 = -iVar9;
  auVar53._4_4_ = iVar12;
  auVar53._0_4_ = iVar12;
  auVar53._8_4_ = iVar12;
  auVar53._12_4_ = iVar12;
  auVar53._16_4_ = iVar12;
  auVar53._20_4_ = iVar12;
  auVar53._24_4_ = iVar12;
  auVar53._28_4_ = iVar12;
  auVar45 = vpmulld_avx2((undefined1  [32])in[0x16],auVar53);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x210);
  auVar62._4_4_ = uVar1;
  auVar62._0_4_ = uVar1;
  auVar62._8_4_ = uVar1;
  auVar62._12_4_ = uVar1;
  auVar62._16_4_ = uVar1;
  auVar62._20_4_ = uVar1;
  auVar62._24_4_ = uVar1;
  auVar62._28_4_ = uVar1;
  auVar44 = vpmulld_avx2((undefined1  [32])in[10],auVar62);
  auVar44 = vpaddd_avx2(auVar44,auVar43);
  auVar44 = vpaddd_avx2(auVar44,auVar45);
  iVar12 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x230);
  iVar6 = -iVar12;
  auVar54._4_4_ = iVar6;
  auVar54._0_4_ = iVar6;
  auVar54._8_4_ = iVar6;
  auVar54._12_4_ = iVar6;
  auVar54._16_4_ = iVar6;
  auVar54._20_4_ = iVar6;
  auVar54._24_4_ = iVar6;
  auVar54._28_4_ = iVar6;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 400);
  auVar68._4_4_ = uVar1;
  auVar68._0_4_ = uVar1;
  auVar68._8_4_ = uVar1;
  auVar68._12_4_ = uVar1;
  auVar68._16_4_ = uVar1;
  auVar68._20_4_ = uVar1;
  auVar68._24_4_ = uVar1;
  auVar68._28_4_ = uVar1;
  auVar49 = vpmulld_avx2((undefined1  [32])in[6],auVar54);
  auVar45 = vpmulld_avx2((undefined1  [32])in[0x1a],auVar68);
  auVar45 = vpaddd_avx2(auVar45,auVar43);
  auVar45 = vpaddd_avx2(auVar45,auVar49);
  auVar66._4_4_ = iVar12;
  auVar66._0_4_ = iVar12;
  auVar66._8_4_ = iVar12;
  auVar66._12_4_ = iVar12;
  auVar66._16_4_ = iVar12;
  auVar66._20_4_ = iVar12;
  auVar66._24_4_ = iVar12;
  auVar66._28_4_ = iVar12;
  auVar49 = vpmulld_avx2((undefined1  [32])in[0x1a],auVar66);
  auVar24 = vpmulld_avx2((undefined1  [32])in[6],auVar68);
  auVar49 = vpaddd_avx2(auVar49,auVar43);
  auVar49 = vpaddd_avx2(auVar49,auVar24);
  auVar24._4_4_ = iVar9;
  auVar24._0_4_ = iVar9;
  auVar24._8_4_ = iVar9;
  auVar24._12_4_ = iVar9;
  auVar24._16_4_ = iVar9;
  auVar24._20_4_ = iVar9;
  auVar24._24_4_ = iVar9;
  auVar24._28_4_ = iVar9;
  auVar24 = vpmulld_avx2((undefined1  [32])in[10],auVar24);
  auVar25 = vpmulld_avx2((undefined1  [32])in[0x16],auVar62);
  auVar24 = vpaddd_avx2(auVar24,auVar43);
  auVar24 = vpaddd_avx2(auVar24,auVar25);
  auVar25._4_4_ = iVar8;
  auVar25._0_4_ = iVar8;
  auVar25._8_4_ = iVar8;
  auVar25._12_4_ = iVar8;
  auVar25._16_4_ = iVar8;
  auVar25._20_4_ = iVar8;
  auVar25._24_4_ = iVar8;
  auVar25._28_4_ = iVar8;
  auVar25 = vpmulld_avx2((undefined1  [32])in[0x12],auVar25);
  auVar26 = vpmulld_avx2((undefined1  [32])in[0xe],auVar46);
  auVar25 = vpaddd_avx2(auVar25,auVar43);
  auVar25 = vpaddd_avx2(auVar25,auVar26);
  auVar26._4_4_ = iVar15;
  auVar26._0_4_ = iVar15;
  auVar26._8_4_ = iVar15;
  auVar26._12_4_ = iVar15;
  auVar26._16_4_ = iVar15;
  auVar26._20_4_ = iVar15;
  auVar26._24_4_ = iVar15;
  auVar26._28_4_ = iVar15;
  auVar26 = vpmulld_avx2((undefined1  [32])in[2],auVar26);
  auVar42 = vpmulld_avx2((undefined1  [32])in[0x1e],auVar42);
  auVar26 = vpaddd_avx2(auVar26,auVar43);
  auVar26 = vpaddd_avx2(auVar26,auVar42);
  auVar42 = vpsrad_avx2(auVar4,ZEXT416((uint)bit));
  auVar40 = vpsrad_avx2(auVar40,ZEXT416((uint)bit));
  auVar4 = vpaddd_avx2(auVar40,auVar42);
  auVar42 = vpsubd_avx2(auVar42,auVar40);
  auVar39 = ZEXT416((uint)bit);
  auVar35 = vpsrad_avx2(auVar35,auVar39);
  auVar29 = vpsrad_avx2(auVar29,auVar39);
  auVar40 = vpaddd_avx2(auVar29,auVar35);
  auVar46 = vpsubd_avx2(auVar29,auVar35);
  auVar29 = vpsrad_avx2(auVar30,auVar39);
  auVar30 = vpsrad_avx2(auVar31,auVar39);
  auVar35 = vpaddd_avx2(auVar30,auVar29);
  auVar50 = vpsubd_avx2(auVar29,auVar30);
  auVar39 = ZEXT416((uint)bit);
  auVar30 = vpsrad_avx2(auVar57,auVar39);
  auVar31 = vpsrad_avx2(auVar60,auVar39);
  auVar29 = vpaddd_avx2(auVar31,auVar30);
  auVar52 = vpsubd_avx2(auVar31,auVar30);
  auVar31 = vpsrad_avx2(auVar61,auVar39);
  auVar57 = vpsrad_avx2(auVar17,auVar39);
  auVar30 = vpaddd_avx2(auVar57,auVar31);
  auVar53 = vpsubd_avx2(auVar31,auVar57);
  auVar57 = vpsrad_avx2(auVar18,auVar39);
  auVar60 = vpsrad_avx2(auVar19,auVar39);
  auVar31 = vpaddd_avx2(auVar60,auVar57);
  auVar54 = vpsubd_avx2(auVar60,auVar57);
  auVar60 = vpsrad_avx2(auVar20,auVar39);
  auVar61 = vpsrad_avx2(auVar21,auVar39);
  auVar57 = vpaddd_avx2(auVar61,auVar60);
  auVar59 = vpsubd_avx2(auVar60,auVar61);
  auVar39 = ZEXT416((uint)bit);
  auVar61 = vpsrad_avx2(auVar22,auVar39);
  auVar17 = vpsrad_avx2(auVar23,auVar39);
  auVar60 = vpaddd_avx2(auVar17,auVar61);
  auVar62 = vpsubd_avx2(auVar17,auVar61);
  iVar15 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x240);
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x180);
  iVar9 = -iVar8;
  auVar32._4_4_ = iVar15;
  auVar32._0_4_ = iVar15;
  auVar32._8_4_ = iVar15;
  auVar32._12_4_ = iVar15;
  auVar32._16_4_ = iVar15;
  auVar32._20_4_ = iVar15;
  auVar32._24_4_ = iVar15;
  auVar32._28_4_ = iVar15;
  auVar55._4_4_ = iVar9;
  auVar55._0_4_ = iVar9;
  auVar55._8_4_ = iVar9;
  auVar55._12_4_ = iVar9;
  auVar55._16_4_ = iVar9;
  auVar55._20_4_ = iVar9;
  auVar55._24_4_ = iVar9;
  auVar55._28_4_ = iVar9;
  auVar61 = vpmulld_avx2((undefined1  [32])in[4],auVar32);
  auVar61 = vpaddd_avx2(auVar61,auVar43);
  auVar17 = vpmulld_avx2((undefined1  [32])in[0x1c],auVar55);
  auVar61 = vpaddd_avx2(auVar61,auVar17);
  iVar9 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1c0);
  iVar12 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x200);
  iVar6 = -iVar12;
  auVar37._4_4_ = iVar9;
  auVar37._0_4_ = iVar9;
  auVar37._8_4_ = iVar9;
  auVar37._12_4_ = iVar9;
  auVar37._16_4_ = iVar9;
  auVar37._20_4_ = iVar9;
  auVar37._24_4_ = iVar9;
  auVar37._28_4_ = iVar9;
  auVar58._4_4_ = iVar6;
  auVar58._0_4_ = iVar6;
  auVar58._8_4_ = iVar6;
  auVar58._12_4_ = iVar6;
  auVar58._16_4_ = iVar6;
  auVar58._20_4_ = iVar6;
  auVar58._24_4_ = iVar6;
  auVar58._28_4_ = iVar6;
  auVar17 = vpmulld_avx2((undefined1  [32])in[0x14],auVar37);
  auVar17 = vpaddd_avx2(auVar17,auVar43);
  auVar18 = vpmulld_avx2((undefined1  [32])in[0xc],auVar58);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  auVar33._4_4_ = iVar12;
  auVar33._0_4_ = iVar12;
  auVar33._8_4_ = iVar12;
  auVar33._12_4_ = iVar12;
  auVar33._16_4_ = iVar12;
  auVar33._20_4_ = iVar12;
  auVar33._24_4_ = iVar12;
  auVar33._28_4_ = iVar12;
  auVar18 = vpmulld_avx2((undefined1  [32])in[0x14],auVar33);
  auVar19 = vpmulld_avx2((undefined1  [32])in[0xc],auVar37);
  auVar18 = vpaddd_avx2(auVar18,auVar43);
  auVar18 = vpaddd_avx2(auVar18,auVar19);
  auVar27._4_4_ = iVar8;
  auVar27._0_4_ = iVar8;
  auVar27._8_4_ = iVar8;
  auVar27._12_4_ = iVar8;
  auVar27._16_4_ = iVar8;
  auVar27._20_4_ = iVar8;
  auVar27._24_4_ = iVar8;
  auVar27._28_4_ = iVar8;
  auVar19 = vpmulld_avx2((undefined1  [32])in[4],auVar27);
  auVar20 = vpmulld_avx2((undefined1  [32])in[0x1c],auVar32);
  auVar19 = vpaddd_avx2(auVar19,auVar43);
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  auVar21 = vpsrad_avx2(auVar36,auVar39);
  auVar22 = vpsrad_avx2(auVar41,auVar39);
  auVar20 = vpaddd_avx2(auVar22,auVar21);
  auVar64 = vpsubd_avx2(auVar21,auVar22);
  auVar22 = vpsrad_avx2(auVar44,auVar39);
  auVar23 = vpsrad_avx2(auVar45,auVar39);
  auVar21 = vpaddd_avx2(auVar23,auVar22);
  auVar44 = vpsubd_avx2(auVar23,auVar22);
  auVar23 = vpsrad_avx2(auVar49,auVar39);
  auVar36 = vpsrad_avx2(auVar24,auVar39);
  auVar22 = vpaddd_avx2(auVar36,auVar23);
  auVar45 = vpsubd_avx2(auVar23,auVar36);
  auVar36 = vpsrad_avx2(auVar25,auVar39);
  auVar41 = vpsrad_avx2(auVar26,auVar39);
  auVar23 = vpaddd_avx2(auVar41,auVar36);
  auVar36 = vpsubd_avx2(auVar41,auVar36);
  iVar15 = -iVar15;
  iVar9 = -iVar9;
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1e0);
  iVar16 = -iVar8;
  iVar12 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x220);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1a0);
  iVar13 = -iVar12;
  iVar14 = -iVar6;
  iVar10 = bd + (uint)(do_cols == 0) * 2;
  iVar7 = 0x8000;
  if (0xf < iVar10 + 6) {
    iVar7 = 1 << ((char)iVar10 + 5U & 0x1f);
  }
  iVar10 = -iVar7;
  iVar7 = iVar7 + -1;
  auVar34._4_4_ = iVar10;
  auVar34._0_4_ = iVar10;
  auVar34._8_4_ = iVar10;
  auVar34._12_4_ = iVar10;
  auVar34._16_4_ = iVar10;
  auVar34._20_4_ = iVar10;
  auVar34._24_4_ = iVar10;
  auVar34._28_4_ = iVar10;
  auVar38._4_4_ = iVar7;
  auVar38._0_4_ = iVar7;
  auVar38._8_4_ = iVar7;
  auVar38._12_4_ = iVar7;
  auVar38._16_4_ = iVar7;
  auVar38._20_4_ = iVar7;
  auVar38._24_4_ = iVar7;
  auVar38._28_4_ = iVar7;
  auVar41 = vpmaxsd_avx2(auVar34,auVar42);
  auVar66 = vpminsd_avx2(auVar41,auVar38);
  auVar41 = vpmaxsd_avx2(auVar62,auVar34);
  auVar62 = vpminsd_avx2(auVar41,auVar38);
  auVar41 = vpmulld_avx2(auVar66,auVar55);
  auVar41 = vpaddd_avx2(auVar43,auVar41);
  auVar49 = vpmulld_avx2(auVar62,auVar32);
  auVar41 = vpaddd_avx2(auVar41,auVar49);
  auVar28._4_4_ = iVar15;
  auVar28._0_4_ = iVar15;
  auVar28._8_4_ = iVar15;
  auVar28._12_4_ = iVar15;
  auVar28._16_4_ = iVar15;
  auVar28._20_4_ = iVar15;
  auVar28._24_4_ = iVar15;
  auVar28._28_4_ = iVar15;
  auVar49 = vpmaxsd_avx2(auVar34,auVar46);
  auVar46 = vpminsd_avx2(auVar49,auVar38);
  auVar49 = vpmaxsd_avx2(auVar59,auVar34);
  auVar59 = vpminsd_avx2(auVar49,auVar38);
  auVar49 = vpmulld_avx2(auVar46,auVar28);
  auVar49 = vpaddd_avx2(auVar43,auVar49);
  auVar24 = vpmulld_avx2(auVar59,auVar55);
  auVar49 = vpaddd_avx2(auVar24,auVar49);
  auVar24 = vpmaxsd_avx2(auVar34,auVar50);
  auVar42 = vpminsd_avx2(auVar24,auVar38);
  auVar24 = vpmaxsd_avx2(auVar34,auVar54);
  auVar50 = vpminsd_avx2(auVar24,auVar38);
  auVar24 = vpmulld_avx2(auVar42,auVar58);
  auVar24 = vpaddd_avx2(auVar43,auVar24);
  auVar25 = vpmulld_avx2(auVar50,auVar37);
  auVar24 = vpaddd_avx2(auVar25,auVar24);
  auVar47._4_4_ = iVar9;
  auVar47._0_4_ = iVar9;
  auVar47._8_4_ = iVar9;
  auVar47._12_4_ = iVar9;
  auVar47._16_4_ = iVar9;
  auVar47._20_4_ = iVar9;
  auVar47._24_4_ = iVar9;
  auVar47._28_4_ = iVar9;
  auVar25 = vpmaxsd_avx2(auVar34,auVar52);
  auVar26 = vpminsd_avx2(auVar25,auVar38);
  auVar25 = vpmaxsd_avx2(auVar34,auVar53);
  auVar52 = vpminsd_avx2(auVar25,auVar38);
  auVar25 = vpmulld_avx2(auVar26,auVar47);
  auVar25 = vpaddd_avx2(auVar43,auVar25);
  auVar53 = vpmulld_avx2(auVar52,auVar58);
  auVar25 = vpaddd_avx2(auVar53,auVar25);
  auVar26 = vpmulld_avx2(auVar26,auVar58);
  auVar52 = vpmulld_avx2(auVar52,auVar37);
  auVar26 = vpaddd_avx2(auVar43,auVar26);
  auVar26 = vpaddd_avx2(auVar52,auVar26);
  auVar42 = vpmulld_avx2(auVar42,auVar37);
  auVar50 = vpmulld_avx2(auVar50,auVar33);
  auVar42 = vpaddd_avx2(auVar43,auVar42);
  auVar42 = vpaddd_avx2(auVar42,auVar50);
  auVar46 = vpmulld_avx2(auVar46,auVar55);
  auVar50 = vpmulld_avx2(auVar59,auVar32);
  auVar46 = vpaddd_avx2(auVar43,auVar46);
  auVar46 = vpaddd_avx2(auVar46,auVar50);
  auVar50 = vpmulld_avx2(auVar32,auVar66);
  auVar52 = vpmulld_avx2(auVar62,auVar27);
  auVar50 = vpaddd_avx2(auVar43,auVar50);
  auVar50 = vpaddd_avx2(auVar50,auVar52);
  auVar48._4_4_ = iVar8;
  auVar48._0_4_ = iVar8;
  auVar48._8_4_ = iVar8;
  auVar48._12_4_ = iVar8;
  auVar48._16_4_ = iVar8;
  auVar48._20_4_ = iVar8;
  auVar48._24_4_ = iVar8;
  auVar48._28_4_ = iVar8;
  auVar56._4_4_ = iVar16;
  auVar56._0_4_ = iVar16;
  auVar56._8_4_ = iVar16;
  auVar56._12_4_ = iVar16;
  auVar56._16_4_ = iVar16;
  auVar56._20_4_ = iVar16;
  auVar56._24_4_ = iVar16;
  auVar56._28_4_ = iVar16;
  auVar53 = vpmulld_avx2((undefined1  [32])*in,auVar48);
  auVar52 = vpaddd_avx2((undefined1  [32])in[0x10],(undefined1  [32])*in);
  auVar54 = vpmulld_avx2((undefined1  [32])in[0x10],auVar56);
  auVar53 = vpaddd_avx2(auVar43,auVar53);
  auVar53 = vpaddd_avx2(auVar53,auVar54);
  auVar63._4_4_ = iVar12;
  auVar63._0_4_ = iVar12;
  auVar63._8_4_ = iVar12;
  auVar63._12_4_ = iVar12;
  auVar63._16_4_ = iVar12;
  auVar63._20_4_ = iVar12;
  auVar63._24_4_ = iVar12;
  auVar63._28_4_ = iVar12;
  auVar65._4_4_ = iVar14;
  auVar65._0_4_ = iVar14;
  auVar65._8_4_ = iVar14;
  auVar65._12_4_ = iVar14;
  auVar65._16_4_ = iVar14;
  auVar65._20_4_ = iVar14;
  auVar65._24_4_ = iVar14;
  auVar65._28_4_ = iVar14;
  auVar54 = vpmulld_avx2((undefined1  [32])in[8],auVar63);
  auVar54 = vpaddd_avx2(auVar43,auVar54);
  auVar59 = vpmulld_avx2((undefined1  [32])in[0x18],auVar65);
  auVar54 = vpaddd_avx2(auVar59,auVar54);
  auVar51._4_4_ = iVar6;
  auVar51._0_4_ = iVar6;
  auVar51._8_4_ = iVar6;
  auVar51._12_4_ = iVar6;
  auVar51._16_4_ = iVar6;
  auVar51._20_4_ = iVar6;
  auVar51._24_4_ = iVar6;
  auVar51._28_4_ = iVar6;
  auVar59 = vpmulld_avx2((undefined1  [32])in[8],auVar51);
  auVar62 = vpmulld_avx2((undefined1  [32])in[0x18],auVar63);
  auVar59 = vpaddd_avx2(auVar43,auVar59);
  auVar59 = vpaddd_avx2(auVar59,auVar62);
  auVar62 = vpsrad_avx2(auVar61,auVar39);
  auVar17 = vpsrad_avx2(auVar17,auVar39);
  auVar61 = vpaddd_avx2(auVar17,auVar62);
  auVar27 = vpsubd_avx2(auVar62,auVar17);
  auVar18 = vpsrad_avx2(auVar18,auVar39);
  auVar19 = vpsrad_avx2(auVar19,auVar39);
  auVar17 = vpaddd_avx2(auVar19,auVar18);
  auVar32 = vpsubd_avx2(auVar19,auVar18);
  auVar18 = vpmaxsd_avx2(auVar34,auVar64);
  auVar62 = vpminsd_avx2(auVar18,auVar38);
  auVar18 = vpmaxsd_avx2(auVar34,auVar36);
  auVar64 = vpminsd_avx2(auVar18,auVar38);
  auVar18 = vpmulld_avx2(auVar62,auVar65);
  auVar18 = vpaddd_avx2(auVar43,auVar18);
  auVar19 = vpmulld_avx2(auVar64,auVar63);
  auVar18 = vpaddd_avx2(auVar19,auVar18);
  auVar67._4_4_ = iVar13;
  auVar67._0_4_ = iVar13;
  auVar67._8_4_ = iVar13;
  auVar67._12_4_ = iVar13;
  auVar67._16_4_ = iVar13;
  auVar67._20_4_ = iVar13;
  auVar67._24_4_ = iVar13;
  auVar67._28_4_ = iVar13;
  auVar19 = vpmaxsd_avx2(auVar34,auVar44);
  auVar36 = vpminsd_avx2(auVar19,auVar38);
  auVar19 = vpmaxsd_avx2(auVar34,auVar45);
  auVar44 = vpminsd_avx2(auVar19,auVar38);
  auVar19 = vpmulld_avx2(auVar36,auVar67);
  auVar19 = vpaddd_avx2(auVar43,auVar19);
  auVar45 = vpmulld_avx2(auVar44,auVar65);
  auVar19 = vpaddd_avx2(auVar19,auVar45);
  auVar36 = vpmulld_avx2(auVar36,auVar65);
  auVar44 = vpmulld_avx2(auVar44,auVar63);
  auVar36 = vpaddd_avx2(auVar43,auVar36);
  auVar36 = vpaddd_avx2(auVar44,auVar36);
  auVar44 = vpmulld_avx2(auVar62,auVar63);
  auVar45 = vpmulld_avx2(auVar64,auVar51);
  auVar44 = vpaddd_avx2(auVar43,auVar44);
  auVar44 = vpaddd_avx2(auVar45,auVar44);
  auVar4 = vpmaxsd_avx2(auVar34,auVar4);
  auVar45 = vpminsd_avx2(auVar4,auVar38);
  auVar4 = vpmaxsd_avx2(auVar34,auVar40);
  auVar40 = vpminsd_avx2(auVar4,auVar38);
  auVar4 = vpaddd_avx2(auVar40,auVar45);
  auVar62 = vpsubd_avx2(auVar45,auVar40);
  auVar41 = vpsrad_avx2(auVar41,auVar39);
  auVar45 = vpsrad_avx2(auVar49,auVar39);
  auVar40 = vpaddd_avx2(auVar45,auVar41);
  auVar64 = vpsubd_avx2(auVar41,auVar45);
  auVar35 = vpmaxsd_avx2(auVar34,auVar35);
  auVar41 = vpminsd_avx2(auVar35,auVar38);
  auVar35 = vpmaxsd_avx2(auVar34,auVar29);
  auVar29 = vpminsd_avx2(auVar35,auVar38);
  auVar35 = vpaddd_avx2(auVar29,auVar41);
  auVar33 = vpsubd_avx2(auVar29,auVar41);
  auVar39 = ZEXT416((uint)bit);
  auVar41 = vpsrad_avx2(auVar24,auVar39);
  auVar45 = vpsrad_avx2(auVar25,auVar39);
  auVar29 = vpaddd_avx2(auVar45,auVar41);
  auVar37 = vpsubd_avx2(auVar45,auVar41);
  auVar30 = vpmaxsd_avx2(auVar34,auVar30);
  auVar41 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpmaxsd_avx2(auVar34,auVar31);
  auVar31 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpaddd_avx2(auVar31,auVar41);
  auVar55 = vpsubd_avx2(auVar41,auVar31);
  auVar41 = vpsrad_avx2(auVar26,auVar39);
  auVar45 = vpsrad_avx2(auVar42,auVar39);
  auVar31 = vpaddd_avx2(auVar45,auVar41);
  auVar58 = vpsubd_avx2(auVar41,auVar45);
  auVar57 = vpmaxsd_avx2(auVar34,auVar57);
  auVar41 = vpminsd_avx2(auVar57,auVar38);
  auVar57 = vpmaxsd_avx2(auVar34,auVar60);
  auVar60 = vpminsd_avx2(auVar57,auVar38);
  auVar57 = vpaddd_avx2(auVar60,auVar41);
  auVar66 = vpsubd_avx2(auVar60,auVar41);
  auVar41 = vpsrad_avx2(auVar46,auVar39);
  auVar45 = vpsrad_avx2(auVar50,auVar39);
  auVar60 = vpaddd_avx2(auVar45,auVar41);
  auVar42 = vpsubd_avx2(auVar45,auVar41);
  auVar41 = vpmulld_avx2(auVar48,auVar52);
  auVar41 = vpaddd_avx2(auVar43,auVar41);
  auVar45 = vpsrad_avx2(auVar41,auVar39);
  auVar49 = vpsrad_avx2(auVar59,auVar39);
  auVar41 = vpaddd_avx2(auVar49,auVar45);
  auVar68 = vpsubd_avx2(auVar45,auVar49);
  auVar49 = vpsrad_avx2(auVar53,auVar39);
  auVar24 = vpsrad_avx2(auVar54,auVar39);
  auVar45 = vpaddd_avx2(auVar24,auVar49);
  auVar69 = vpsubd_avx2(auVar49,auVar24);
  auVar49 = vpmaxsd_avx2(auVar34,auVar27);
  auVar24 = vpminsd_avx2(auVar49,auVar38);
  auVar49 = vpmaxsd_avx2(auVar34,auVar32);
  auVar25 = vpminsd_avx2(auVar49,auVar38);
  auVar49 = vpmulld_avx2(auVar24,auVar56);
  auVar49 = vpaddd_avx2(auVar49,auVar43);
  auVar26 = vpmulld_avx2(auVar25,auVar48);
  auVar49 = vpaddd_avx2(auVar49,auVar26);
  auVar24 = vpaddd_avx2(auVar25,auVar24);
  auVar20 = vpmaxsd_avx2(auVar34,auVar20);
  auVar25 = vpminsd_avx2(auVar20,auVar38);
  auVar20 = vpmaxsd_avx2(auVar34,auVar21);
  auVar21 = vpsrad_avx2(auVar18,auVar39);
  auVar20 = vpminsd_avx2(auVar20,auVar38);
  auVar26 = vpsrad_avx2(auVar19,auVar39);
  auVar18 = vpaddd_avx2(auVar20,auVar25);
  auVar27 = vpsubd_avx2(auVar25,auVar20);
  auVar19 = vpaddd_avx2(auVar21,auVar26);
  auVar32 = vpsubd_avx2(auVar21,auVar26);
  auVar20 = vpmaxsd_avx2(auVar34,auVar22);
  auVar21 = vpminsd_avx2(auVar20,auVar38);
  auVar20 = vpmaxsd_avx2(auVar34,auVar23);
  auVar23 = vpsrad_avx2(auVar36,auVar39);
  auVar22 = vpminsd_avx2(auVar20,auVar38);
  auVar36 = vpsrad_avx2(auVar44,auVar39);
  auVar20 = vpaddd_avx2(auVar22,auVar21);
  auVar70 = vpsubd_avx2(auVar22,auVar21);
  auVar21 = vpaddd_avx2(auVar36,auVar23);
  auVar28 = vpsubd_avx2(auVar36,auVar23);
  auVar22 = vpmaxsd_avx2(auVar34,auVar64);
  auVar46 = vpminsd_avx2(auVar22,auVar38);
  auVar22 = vpmaxsd_avx2(auVar42,auVar34);
  auVar50 = vpminsd_avx2(auVar22,auVar38);
  auVar22 = vpmulld_avx2(auVar46,auVar65);
  auVar22 = vpaddd_avx2(auVar22,auVar43);
  auVar23 = vpmulld_avx2(auVar50,auVar63);
  auVar22 = vpaddd_avx2(auVar22,auVar23);
  auVar23 = vpmaxsd_avx2(auVar34,auVar62);
  auVar42 = vpminsd_avx2(auVar23,auVar38);
  auVar23 = vpmaxsd_avx2(auVar66,auVar34);
  auVar52 = vpminsd_avx2(auVar23,auVar38);
  auVar23 = vpmulld_avx2(auVar42,auVar65);
  auVar23 = vpaddd_avx2(auVar23,auVar43);
  auVar36 = vpmulld_avx2(auVar52,auVar63);
  auVar23 = vpaddd_avx2(auVar23,auVar36);
  auVar36 = vpmaxsd_avx2(auVar34,auVar33);
  auVar26 = vpminsd_avx2(auVar36,auVar38);
  auVar36 = vpmaxsd_avx2(auVar34,auVar55);
  auVar53 = vpminsd_avx2(auVar36,auVar38);
  auVar36 = vpmulld_avx2(auVar26,auVar67);
  auVar36 = vpaddd_avx2(auVar36,auVar43);
  auVar44 = vpmulld_avx2(auVar53,auVar65);
  auVar36 = vpaddd_avx2(auVar36,auVar44);
  auVar44 = vpmaxsd_avx2(auVar34,auVar37);
  auVar25 = vpminsd_avx2(auVar44,auVar38);
  auVar44 = vpmaxsd_avx2(auVar34,auVar58);
  auVar54 = vpminsd_avx2(auVar44,auVar38);
  auVar44 = vpmulld_avx2(auVar25,auVar67);
  auVar44 = vpaddd_avx2(auVar44,auVar43);
  auVar59 = vpmulld_avx2(auVar54,auVar65);
  auVar44 = vpaddd_avx2(auVar44,auVar59);
  auVar25 = vpmulld_avx2(auVar25,auVar65);
  auVar54 = vpmulld_avx2(auVar54,auVar63);
  auVar25 = vpaddd_avx2(auVar25,auVar43);
  auVar25 = vpaddd_avx2(auVar25,auVar54);
  auVar26 = vpmulld_avx2(auVar26,auVar65);
  auVar53 = vpmulld_avx2(auVar53,auVar63);
  auVar26 = vpaddd_avx2(auVar26,auVar43);
  auVar26 = vpaddd_avx2(auVar26,auVar53);
  auVar42 = vpmulld_avx2(auVar42,auVar63);
  auVar52 = vpmulld_avx2(auVar52,auVar51);
  auVar42 = vpaddd_avx2(auVar42,auVar43);
  auVar42 = vpaddd_avx2(auVar42,auVar52);
  auVar46 = vpmulld_avx2(auVar46,auVar63);
  auVar50 = vpmulld_avx2(auVar50,auVar51);
  auVar46 = vpaddd_avx2(auVar46,auVar43);
  auVar46 = vpaddd_avx2(auVar46,auVar50);
  auVar17 = vpmaxsd_avx2(auVar34,auVar17);
  auVar50 = vpminsd_avx2(auVar17,auVar38);
  auVar17 = vpmaxsd_avx2(auVar34,auVar41);
  auVar41 = vpminsd_avx2(auVar17,auVar38);
  auVar17 = vpaddd_avx2(auVar41,auVar50);
  auVar62 = vpsubd_avx2(auVar41,auVar50);
  auVar41 = vpmaxsd_avx2(auVar34,auVar45);
  auVar45 = vpminsd_avx2(auVar41,auVar38);
  auVar41 = vpmulld_avx2(auVar48,auVar24);
  auVar41 = vpaddd_avx2(auVar41,auVar43);
  auVar24 = vpsrad_avx2(auVar41,auVar39);
  auVar41 = vpaddd_avx2(auVar24,auVar45);
  auVar64 = vpsubd_avx2(auVar45,auVar24);
  auVar45 = vpmaxsd_avx2(auVar34,auVar69);
  auVar24 = vpsrad_avx2(auVar49,auVar39);
  auVar49 = vpminsd_avx2(auVar45,auVar38);
  auVar45 = vpaddd_avx2(auVar24,auVar49);
  auVar33 = vpsubd_avx2(auVar49,auVar24);
  auVar61 = vpmaxsd_avx2(auVar34,auVar61);
  auVar49 = vpminsd_avx2(auVar61,auVar38);
  auVar61 = vpmaxsd_avx2(auVar34,auVar68);
  auVar24 = vpminsd_avx2(auVar61,auVar38);
  auVar61 = vpaddd_avx2(auVar24,auVar49);
  auVar37 = vpsubd_avx2(auVar24,auVar49);
  auVar49 = vpmaxsd_avx2(auVar34,auVar32);
  auVar52 = vpminsd_avx2(auVar49,auVar38);
  auVar49 = vpmaxsd_avx2(auVar34,auVar28);
  auVar53 = vpminsd_avx2(auVar49,auVar38);
  auVar49 = vpmulld_avx2(auVar52,auVar56);
  auVar49 = vpaddd_avx2(auVar49,auVar43);
  auVar24 = vpmulld_avx2(auVar53,auVar48);
  auVar49 = vpaddd_avx2(auVar24,auVar49);
  auVar24 = vpmaxsd_avx2(auVar34,auVar27);
  auVar50 = vpminsd_avx2(auVar24,auVar38);
  auVar24 = vpmaxsd_avx2(auVar34,auVar70);
  auVar54 = vpminsd_avx2(auVar24,auVar38);
  auVar24 = vpmulld_avx2(auVar50,auVar56);
  auVar24 = vpaddd_avx2(auVar24,auVar43);
  auVar59 = vpmulld_avx2(auVar54,auVar48);
  auVar24 = vpaddd_avx2(auVar24,auVar59);
  auVar50 = vpaddd_avx2(auVar54,auVar50);
  auVar52 = vpaddd_avx2(auVar53,auVar52);
  auVar4 = vpmaxsd_avx2(auVar34,auVar4);
  auVar53 = vpminsd_avx2(auVar4,auVar38);
  auVar4 = vpmaxsd_avx2(auVar34,auVar35);
  auVar35 = vpminsd_avx2(auVar4,auVar38);
  auVar4 = vpaddd_avx2(auVar35,auVar53);
  auVar53 = vpsubd_avx2(auVar53,auVar35);
  auVar40 = vpmaxsd_avx2(auVar34,auVar40);
  auVar35 = vpminsd_avx2(auVar40,auVar38);
  auVar40 = vpmaxsd_avx2(auVar34,auVar29);
  auVar22 = vpsrad_avx2(auVar22,auVar39);
  auVar23 = vpsrad_avx2(auVar23,auVar39);
  auVar29 = vpminsd_avx2(auVar40,auVar38);
  auVar36 = vpsrad_avx2(auVar36,auVar39);
  auVar40 = vpaddd_avx2(auVar29,auVar35);
  auVar54 = vpsubd_avx2(auVar35,auVar29);
  auVar29 = vpsrad_avx2(auVar44,auVar39);
  auVar35 = vpaddd_avx2(auVar22,auVar29);
  auVar44 = vpsubd_avx2(auVar22,auVar29);
  auVar29 = vpaddd_avx2(auVar36,auVar23);
  auVar59 = vpsubd_avx2(auVar23,auVar36);
  auVar30 = vpmaxsd_avx2(auVar34,auVar30);
  auVar22 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpmaxsd_avx2(auVar34,auVar57);
  auVar57 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpaddd_avx2(auVar57,auVar22);
  auVar27 = vpsubd_avx2(auVar57,auVar22);
  auVar31 = vpmaxsd_avx2(auVar34,auVar31);
  auVar57 = vpminsd_avx2(auVar31,auVar38);
  auVar31 = vpmaxsd_avx2(auVar34,auVar60);
  auVar22 = vpsrad_avx2(auVar25,auVar39);
  auVar23 = vpsrad_avx2(auVar26,auVar39);
  auVar60 = vpminsd_avx2(auVar31,auVar38);
  auVar36 = vpsrad_avx2(auVar42,auVar39);
  auVar31 = vpaddd_avx2(auVar60,auVar57);
  auVar32 = vpsubd_avx2(auVar60,auVar57);
  auVar60 = vpsrad_avx2(auVar46,auVar39);
  auVar57 = vpaddd_avx2(auVar22,auVar60);
  auVar46 = vpsubd_avx2(auVar60,auVar22);
  auVar60 = vpaddd_avx2(auVar36,auVar23);
  auVar25 = vpsubd_avx2(auVar36,auVar23);
  auVar20 = vpmaxsd_avx2(auVar34,auVar20);
  auVar20 = vpminsd_avx2(auVar20,auVar38);
  auVar17 = vpmaxsd_avx2(auVar34,auVar17);
  auVar22 = vpminsd_avx2(auVar17,auVar38);
  auVar17 = vpaddd_avx2(auVar22,auVar20);
  auVar55 = vpsubd_avx2(auVar22,auVar20);
  auVar20 = vpmaxsd_avx2(auVar34,auVar21);
  auVar21 = vpminsd_avx2(auVar20,auVar38);
  auVar20 = vpmaxsd_avx2(auVar34,auVar41);
  auVar22 = vpminsd_avx2(auVar20,auVar38);
  auVar20 = vpaddd_avx2(auVar22,auVar21);
  auVar58 = vpsubd_avx2(auVar22,auVar21);
  auVar22 = vpmaxsd_avx2(auVar34,auVar45);
  auVar21 = vpmulld_avx2(auVar52,auVar48);
  auVar21 = vpaddd_avx2(auVar21,auVar43);
  auVar23 = vpsrad_avx2(auVar21,auVar39);
  auVar22 = vpminsd_avx2(auVar22,auVar38);
  auVar21 = vpaddd_avx2(auVar22,auVar23);
  auVar66 = vpsubd_avx2(auVar22,auVar23);
  auVar22 = vpmaxsd_avx2(auVar34,auVar61);
  auVar61 = vpmulld_avx2(auVar50,auVar48);
  auVar61 = vpaddd_avx2(auVar61,auVar43);
  auVar23 = vpsrad_avx2(auVar61,auVar39);
  auVar22 = vpminsd_avx2(auVar22,auVar38);
  auVar61 = vpaddd_avx2(auVar23,auVar22);
  auVar68 = vpsubd_avx2(auVar22,auVar23);
  auVar22 = vpmaxsd_avx2(auVar34,auVar37);
  auVar23 = vpminsd_avx2(auVar22,auVar38);
  auVar36 = vpsrad_avx2(auVar24,auVar39);
  auVar22 = vpaddd_avx2(auVar36,auVar23);
  auVar37 = vpsubd_avx2(auVar23,auVar36);
  auVar23 = vpmaxsd_avx2(auVar34,auVar33);
  auVar41 = vpsrad_avx2(auVar49,auVar39);
  auVar36 = vpminsd_avx2(auVar23,auVar38);
  auVar23 = vpaddd_avx2(auVar41,auVar36);
  auVar33 = vpsubd_avx2(auVar36,auVar41);
  auVar19 = vpmaxsd_avx2(auVar34,auVar19);
  auVar36 = vpminsd_avx2(auVar19,auVar38);
  auVar19 = vpmaxsd_avx2(auVar34,auVar64);
  auVar41 = vpminsd_avx2(auVar19,auVar38);
  auVar19 = vpaddd_avx2(auVar41,auVar36);
  auVar64 = vpsubd_avx2(auVar41,auVar36);
  auVar18 = vpmaxsd_avx2(auVar34,auVar18);
  auVar36 = vpminsd_avx2(auVar18,auVar38);
  auVar18 = vpmaxsd_avx2(auVar34,auVar62);
  auVar41 = vpminsd_avx2(auVar18,auVar38);
  auVar18 = vpaddd_avx2(auVar41,auVar36);
  auVar62 = vpsubd_avx2(auVar41,auVar36);
  auVar36 = vpmaxsd_avx2(auVar59,auVar34);
  auVar26 = vpminsd_avx2(auVar36,auVar38);
  auVar36 = vpmaxsd_avx2(auVar25,auVar34);
  auVar42 = vpminsd_avx2(auVar36,auVar38);
  auVar36 = vpmulld_avx2(auVar26,auVar56);
  auVar36 = vpaddd_avx2(auVar36,auVar43);
  auVar41 = vpmulld_avx2(auVar42,auVar48);
  auVar36 = vpaddd_avx2(auVar36,auVar41);
  auVar41 = vpmaxsd_avx2(auVar34,auVar44);
  auVar25 = vpminsd_avx2(auVar41,auVar38);
  auVar41 = vpmaxsd_avx2(auVar46,auVar34);
  auVar46 = vpminsd_avx2(auVar41,auVar38);
  auVar41 = vpmulld_avx2(auVar25,auVar56);
  auVar41 = vpaddd_avx2(auVar41,auVar43);
  auVar44 = vpmulld_avx2(auVar46,auVar48);
  auVar41 = vpaddd_avx2(auVar41,auVar44);
  auVar44 = vpmaxsd_avx2(auVar34,auVar54);
  auVar24 = vpminsd_avx2(auVar44,auVar38);
  auVar44 = vpmaxsd_avx2(auVar32,auVar34);
  auVar50 = vpminsd_avx2(auVar44,auVar38);
  auVar44 = vpmulld_avx2(auVar24,auVar56);
  auVar44 = vpaddd_avx2(auVar44,auVar43);
  auVar45 = vpmulld_avx2(auVar50,auVar48);
  auVar44 = vpaddd_avx2(auVar44,auVar45);
  auVar45 = vpmaxsd_avx2(auVar34,auVar53);
  auVar49 = vpminsd_avx2(auVar45,auVar38);
  auVar45 = vpmaxsd_avx2(auVar34,auVar27);
  auVar52 = vpminsd_avx2(auVar45,auVar38);
  auVar45 = vpmulld_avx2(auVar49,auVar56);
  auVar45 = vpaddd_avx2(auVar45,auVar43);
  auVar53 = vpmulld_avx2(auVar52,auVar48);
  auVar45 = vpaddd_avx2(auVar45,auVar53);
  auVar49 = vpaddd_avx2(auVar52,auVar49);
  auVar24 = vpaddd_avx2(auVar24,auVar50);
  auVar25 = vpaddd_avx2(auVar25,auVar46);
  auVar46 = vpsrad_avx2(auVar36,auVar39);
  auVar50 = vpsrad_avx2(auVar41,auVar39);
  auVar52 = vpsrad_avx2(auVar44,auVar39);
  auVar36 = vpaddd_avx2(auVar42,auVar26);
  auVar45 = vpsrad_avx2(auVar45,auVar39);
  auVar41 = vpmulld_avx2(auVar49,auVar48);
  auVar41 = vpaddd_avx2(auVar41,auVar43);
  auVar39 = ZEXT416((uint)bit);
  auVar49 = vpsrad_avx2(auVar41,auVar39);
  auVar41 = vpmulld_avx2(auVar24,auVar48);
  auVar41 = vpaddd_avx2(auVar41,auVar43);
  auVar24 = vpsrad_avx2(auVar41,auVar39);
  auVar41 = vpmulld_avx2(auVar25,auVar48);
  auVar44 = vpmulld_avx2(auVar36,auVar48);
  auVar36 = vpaddd_avx2(auVar41,auVar43);
  auVar41 = vpsrad_avx2(auVar36,auVar39);
  auVar36 = vpaddd_avx2(auVar44,auVar43);
  auVar44 = vpsrad_avx2(auVar36,auVar39);
  auVar30 = vpmaxsd_avx2(auVar34,auVar30);
  auVar36 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpmaxsd_avx2(auVar34,auVar17);
  auVar17 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpaddd_avx2(auVar17,auVar36);
  auVar17 = vpsubd_avx2(auVar17,auVar36);
  auVar30 = vpmaxsd_avx2(auVar30,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  *out = alVar2;
  auVar30 = vpmaxsd_avx2(auVar17,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[0x1f] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar34,auVar31);
  auVar31 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpmaxsd_avx2(auVar34,auVar20);
  auVar17 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpaddd_avx2(auVar17,auVar31);
  auVar31 = vpsubd_avx2(auVar17,auVar31);
  auVar30 = vpmaxsd_avx2(auVar30,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[1] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar31,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[0x1e] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar34,auVar57);
  auVar31 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpmaxsd_avx2(auVar34,auVar21);
  auVar57 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpaddd_avx2(auVar57,auVar31);
  auVar31 = vpsubd_avx2(auVar57,auVar31);
  auVar30 = vpmaxsd_avx2(auVar30,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[2] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar31,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[0x1d] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar34,auVar60);
  auVar31 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpmaxsd_avx2(auVar34,auVar61);
  auVar57 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpaddd_avx2(auVar57,auVar31);
  auVar31 = vpsubd_avx2(auVar57,auVar31);
  auVar30 = vpmaxsd_avx2(auVar30,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[3] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar31,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[0x1c] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar34,auVar22);
  auVar31 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpaddd_avx2(auVar44,auVar31);
  auVar31 = vpsubd_avx2(auVar31,auVar44);
  auVar30 = vpmaxsd_avx2(auVar30,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[4] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar31,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[0x1b] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar34,auVar23);
  auVar31 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpaddd_avx2(auVar41,auVar31);
  auVar31 = vpsubd_avx2(auVar31,auVar41);
  auVar30 = vpmaxsd_avx2(auVar30,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[5] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar31,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[0x1a] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar34,auVar19);
  auVar31 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpaddd_avx2(auVar24,auVar31);
  auVar31 = vpsubd_avx2(auVar31,auVar24);
  auVar30 = vpmaxsd_avx2(auVar30,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[6] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar31,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[0x19] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar34,auVar18);
  auVar31 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpaddd_avx2(auVar49,auVar31);
  auVar31 = vpsubd_avx2(auVar31,auVar49);
  auVar30 = vpmaxsd_avx2(auVar30,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[7] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar31,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[0x18] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar34,auVar62);
  auVar31 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpaddd_avx2(auVar45,auVar31);
  auVar31 = vpsubd_avx2(auVar31,auVar45);
  auVar30 = vpmaxsd_avx2(auVar30,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[8] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar31,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[0x17] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar34,auVar64);
  auVar31 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpaddd_avx2(auVar52,auVar31);
  auVar57 = vpsubd_avx2(auVar31,auVar52);
  auVar30 = vpmaxsd_avx2(auVar30,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[9] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar34,auVar33);
  auVar31 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpmaxsd_avx2(auVar57,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[0x16] = alVar2;
  auVar30 = vpaddd_avx2(auVar50,auVar31);
  auVar57 = vpsubd_avx2(auVar31,auVar50);
  auVar30 = vpmaxsd_avx2(auVar30,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[10] = alVar2;
  auVar30 = vpmaxsd_avx2(auVar34,auVar37);
  auVar31 = vpminsd_avx2(auVar30,auVar38);
  auVar30 = vpmaxsd_avx2(auVar57,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[0x15] = alVar2;
  auVar30 = vpaddd_avx2(auVar46,auVar31);
  auVar57 = vpsubd_avx2(auVar31,auVar46);
  auVar30 = vpmaxsd_avx2(auVar30,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar38);
  out[0xb] = alVar2;
  auVar29 = vpmaxsd_avx2(auVar34,auVar29);
  auVar30 = vpminsd_avx2(auVar29,auVar38);
  auVar29 = vpmaxsd_avx2(auVar34,auVar68);
  auVar31 = vpminsd_avx2(auVar29,auVar38);
  auVar29 = vpmaxsd_avx2(auVar57,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar29,auVar38);
  out[0x14] = alVar2;
  auVar29 = vpaddd_avx2(auVar31,auVar30);
  auVar31 = vpsubd_avx2(auVar31,auVar30);
  auVar29 = vpmaxsd_avx2(auVar29,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar29,auVar38);
  out[0xc] = alVar2;
  auVar35 = vpmaxsd_avx2(auVar34,auVar35);
  auVar29 = vpminsd_avx2(auVar35,auVar38);
  auVar35 = vpmaxsd_avx2(auVar34,auVar66);
  auVar30 = vpminsd_avx2(auVar35,auVar38);
  auVar35 = vpmaxsd_avx2(auVar31,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar35,auVar38);
  out[0x13] = alVar2;
  auVar35 = vpaddd_avx2(auVar30,auVar29);
  auVar30 = vpsubd_avx2(auVar30,auVar29);
  auVar35 = vpmaxsd_avx2(auVar35,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar35,auVar38);
  out[0xd] = alVar2;
  auVar40 = vpmaxsd_avx2(auVar34,auVar40);
  auVar35 = vpminsd_avx2(auVar40,auVar38);
  auVar40 = vpmaxsd_avx2(auVar34,auVar58);
  auVar29 = vpminsd_avx2(auVar40,auVar38);
  auVar40 = vpmaxsd_avx2(auVar30,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar40,auVar38);
  out[0x12] = alVar2;
  auVar40 = vpaddd_avx2(auVar29,auVar35);
  auVar29 = vpsubd_avx2(auVar29,auVar35);
  auVar40 = vpmaxsd_avx2(auVar40,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar40,auVar38);
  out[0xe] = alVar2;
  auVar4 = vpmaxsd_avx2(auVar34,auVar4);
  auVar40 = vpminsd_avx2(auVar4,auVar38);
  auVar4 = vpmaxsd_avx2(auVar34,auVar55);
  auVar35 = vpminsd_avx2(auVar4,auVar38);
  auVar4 = vpmaxsd_avx2(auVar29,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar4,auVar38);
  out[0x11] = alVar2;
  auVar4 = vpaddd_avx2(auVar35,auVar40);
  auVar40 = vpsubd_avx2(auVar35,auVar40);
  auVar4 = vpmaxsd_avx2(auVar4,auVar34);
  auVar40 = vpmaxsd_avx2(auVar40,auVar34);
  alVar2 = (__m256i)vpminsd_avx2(auVar4,auVar38);
  alVar3 = (__m256i)vpminsd_avx2(auVar40,auVar38);
  out[0xf] = alVar2;
  out[0x10] = alVar3;
  if (do_cols == 0) {
    bVar5 = 10;
    if (10 < bd) {
      bVar5 = (byte)bd;
    }
    local_a0 = 0x20 << (bVar5 & 0x1f);
    local_80 = -local_a0;
    local_a0 = local_a0 + -1;
    iStack_9c = local_a0;
    iStack_98 = local_a0;
    iStack_94 = local_a0;
    iStack_90 = local_a0;
    iStack_8c = local_a0;
    iStack_88 = local_a0;
    iStack_84 = local_a0;
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    round_shift_8x8_avx2(out,out_shift);
    round_shift_8x8_avx2(out + 0x10,out_shift);
    highbd_clamp_epi32_avx2(out,out,(__m256i *)&local_80,(__m256i *)&local_a0,0x20);
  }
  return;
}

Assistant:

static void idct32_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  __m256i cospi_p62_m02 = pair_set_w16_epi16(cospi[62], -cospi[2]);
  __m256i cospi_p02_p62 = pair_set_w16_epi16(cospi[2], cospi[62]);
  __m256i cospi_p30_m34 = pair_set_w16_epi16(cospi[30], -cospi[34]);
  __m256i cospi_p34_p30 = pair_set_w16_epi16(cospi[34], cospi[30]);
  __m256i cospi_p46_m18 = pair_set_w16_epi16(cospi[46], -cospi[18]);
  __m256i cospi_p18_p46 = pair_set_w16_epi16(cospi[18], cospi[46]);
  __m256i cospi_p14_m50 = pair_set_w16_epi16(cospi[14], -cospi[50]);
  __m256i cospi_p50_p14 = pair_set_w16_epi16(cospi[50], cospi[14]);
  __m256i cospi_p54_m10 = pair_set_w16_epi16(cospi[54], -cospi[10]);
  __m256i cospi_p10_p54 = pair_set_w16_epi16(cospi[10], cospi[54]);
  __m256i cospi_p22_m42 = pair_set_w16_epi16(cospi[22], -cospi[42]);
  __m256i cospi_p42_p22 = pair_set_w16_epi16(cospi[42], cospi[22]);
  __m256i cospi_p38_m26 = pair_set_w16_epi16(cospi[38], -cospi[26]);
  __m256i cospi_p26_p38 = pair_set_w16_epi16(cospi[26], cospi[38]);
  __m256i cospi_p06_m58 = pair_set_w16_epi16(cospi[6], -cospi[58]);
  __m256i cospi_p58_p06 = pair_set_w16_epi16(cospi[58], cospi[6]);
  __m256i cospi_p60_m04 = pair_set_w16_epi16(cospi[60], -cospi[4]);
  __m256i cospi_p04_p60 = pair_set_w16_epi16(cospi[4], cospi[60]);
  __m256i cospi_p28_m36 = pair_set_w16_epi16(cospi[28], -cospi[36]);
  __m256i cospi_p36_p28 = pair_set_w16_epi16(cospi[36], cospi[28]);
  __m256i cospi_p44_m20 = pair_set_w16_epi16(cospi[44], -cospi[20]);
  __m256i cospi_p20_p44 = pair_set_w16_epi16(cospi[20], cospi[44]);
  __m256i cospi_p12_m52 = pair_set_w16_epi16(cospi[12], -cospi[52]);
  __m256i cospi_p52_p12 = pair_set_w16_epi16(cospi[52], cospi[12]);
  __m256i cospi_p56_m08 = pair_set_w16_epi16(cospi[56], -cospi[8]);
  __m256i cospi_p08_p56 = pair_set_w16_epi16(cospi[8], cospi[56]);
  __m256i cospi_p24_m40 = pair_set_w16_epi16(cospi[24], -cospi[40]);
  __m256i cospi_p40_p24 = pair_set_w16_epi16(cospi[40], cospi[24]);
  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);
  __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);

  // stage 1
  __m256i x1[32];
  x1[0] = input[0];
  x1[1] = input[16];
  x1[2] = input[8];
  x1[3] = input[24];
  x1[4] = input[4];
  x1[5] = input[20];
  x1[6] = input[12];
  x1[7] = input[28];
  x1[8] = input[2];
  x1[9] = input[18];
  x1[10] = input[10];
  x1[11] = input[26];
  x1[12] = input[6];
  x1[13] = input[22];
  x1[14] = input[14];
  x1[15] = input[30];
  x1[16] = input[1];
  x1[17] = input[17];
  x1[18] = input[9];
  x1[19] = input[25];
  x1[20] = input[5];
  x1[21] = input[21];
  x1[22] = input[13];
  x1[23] = input[29];
  x1[24] = input[3];
  x1[25] = input[19];
  x1[26] = input[11];
  x1[27] = input[27];
  x1[28] = input[7];
  x1[29] = input[23];
  x1[30] = input[15];
  x1[31] = input[31];

  // stage 2
  btf_16_w16_avx2(cospi_p62_m02, cospi_p02_p62, &x1[16], &x1[31], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p30_m34, cospi_p34_p30, &x1[17], &x1[30], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p46_m18, cospi_p18_p46, &x1[18], &x1[29], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p14_m50, cospi_p50_p14, &x1[19], &x1[28], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p54_m10, cospi_p10_p54, &x1[20], &x1[27], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p22_m42, cospi_p42_p22, &x1[21], &x1[26], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p38_m26, cospi_p26_p38, &x1[22], &x1[25], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p06_m58, cospi_p58_p06, &x1[23], &x1[24], _r,
                  INV_COS_BIT);

  // stage 3
  btf_16_w16_avx2(cospi_p60_m04, cospi_p04_p60, &x1[8], &x1[15], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p28_m36, cospi_p36_p28, &x1[9], &x1[14], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p44_m20, cospi_p20_p44, &x1[10], &x1[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p12_m52, cospi_p52_p12, &x1[11], &x1[12], _r,
                  INV_COS_BIT);
  idct32_high16_stage3_avx2(x1);

  // stage 4
  btf_16_w16_avx2(cospi_p56_m08, cospi_p08_p56, &x1[4], &x1[7], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p24_m40, cospi_p40_p24, &x1[5], &x1[6], _r,
                  INV_COS_BIT);
  btf_16_adds_subs_avx2(&x1[8], &x1[9]);
  btf_16_adds_subs_avx2(&x1[11], &x1[10]);
  btf_16_adds_subs_avx2(&x1[12], &x1[13]);
  btf_16_adds_subs_avx2(&x1[15], &x1[14]);
  idct32_high16_stage4_avx2(x1, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[0], &x1[1], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p48_m16, cospi_p16_p48, &x1[2], &x1[3], _r,
                  INV_COS_BIT);
  btf_16_adds_subs_avx2(&x1[4], &x1[5]);
  btf_16_adds_subs_avx2(&x1[7], &x1[6]);
  idct32_high24_stage5_avx2(x1, cospi, _r, INV_COS_BIT);

  // stage 6
  btf_16_adds_subs_avx2(&x1[0], &x1[3]);
  btf_16_adds_subs_avx2(&x1[1], &x1[2]);
  idct32_high28_stage6_avx2(x1, cospi, _r, INV_COS_BIT);

  idct32_stage7_avx2(x1, cospi, _r, INV_COS_BIT);
  idct32_stage8_avx2(x1, cospi, _r, INV_COS_BIT);
  idct32_stage9_avx2(output, x1);
}